

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void filter<float>(TWaveformT<float> *waveform,EAudioFilter filterId,float freqCutoff_Hz,
                  int64_t sampleRate)

{
  float fVar1;
  float *pfVar2;
  float fVar3;
  float *s;
  float *pfVar4;
  TWaveformT<float> *__range3;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  TSampleF xn_1;
  TSampleF xn;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if (filterId != None) {
    if (filterId == SecondOrderButterworthHighPass) {
      dVar7 = tan(((double)(int)freqCutoff_Hz * 3.141592653589793) / (double)(int)sampleRate);
      pfVar4 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pfVar4 != pfVar2) {
        fVar6 = (float)dVar7;
        fVar1 = fVar6 * fVar6;
        fVar3 = 1.0 / (fVar6 * 1.4142135 + 1.0 + fVar1);
        fVar13 = 0.0;
        fVar11 = 0.0;
        fVar12 = 0.0;
        fVar5 = 0.0;
        do {
          fVar9 = fVar13;
          fVar10 = *pfVar4;
          fVar13 = fVar11 * -((fVar6 * -1.4142135 + 1.0 + fVar1) * fVar3) +
                   -((fVar3 + fVar3) * (fVar1 + -1.0)) * fVar9 +
                   fVar12 * fVar3 + fVar3 * fVar10 + fVar3 * -2.0 * fVar5;
          *pfVar4 = fVar13;
          pfVar4 = pfVar4 + 1;
          fVar11 = fVar9;
          fVar12 = fVar5;
          fVar5 = fVar10;
        } while (pfVar4 != pfVar2);
      }
    }
    else {
      if (filterId != FirstOrderHighPass) {
        fprintf(_stderr,"Unknown filter type: %d\n",filterId);
        return;
      }
      dVar7 = (double)(((float)(int)freqCutoff_Hz * 6.2831855) / (float)(int)sampleRate);
      dVar8 = cos(dVar7);
      dVar7 = sin(dVar7);
      pfVar4 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar2 = (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pfVar4 != pfVar2) {
        fVar5 = (float)(dVar8 / (dVar7 + 1.0));
        fVar3 = (fVar5 + 1.0) * 0.5;
        fVar1 = 0.0;
        fVar13 = 0.0;
        fVar11 = 0.0;
        fVar12 = 0.0;
        do {
          fVar6 = fVar1;
          fVar1 = *pfVar4;
          fVar10 = fVar13 * -0.0 + fVar5 * fVar12 + fVar11 * 0.0 + fVar3 * fVar1 + fVar6 * -fVar3;
          *pfVar4 = fVar10;
          pfVar4 = pfVar4 + 1;
          fVar13 = fVar12;
          fVar11 = fVar6;
          fVar12 = fVar10;
        } while (pfVar4 != pfVar2);
      }
    }
  }
  return;
}

Assistant:

void filter(TWaveformT<TSample> & waveform, EAudioFilter filterId, float freqCutoff_Hz, int64_t sampleRate) {
    switch (filterId) {
        case EAudioFilter::None:
            {
                return;
            }
            break;
        case EAudioFilter::FirstOrderHighPass:
            {
                auto filterCoefficients = ::calculateCoefficientsFirstOrderHighPass(freqCutoff_Hz, sampleRate);
                for (auto & s : waveform) {
                    s = ::filterFirstOrderHighPass(filterCoefficients, s);
                }
                return;
            }
            break;
        case EAudioFilter::SecondOrderButterworthHighPass:
            {
                auto filterCoefficients = ::calculateCoefficientsSecondOrderButterworthHighPass(freqCutoff_Hz, sampleRate);
                for (auto & s : waveform) {
                    s = ::filterSecondOrderButterworthHighPass(filterCoefficients, s);
                }
                return;
            }
            break;
    }

    fprintf(stderr, "Unknown filter type: %d\n", filterId);
}